

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O3

SyntaxTreeNode * __thiscall
RegexToDFAConverter::factor_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  pointer *pppSVar1;
  char cVar2;
  int iVar3;
  iterator __position;
  uint uVar4;
  SyntaxTreeNode *this_00;
  SyntaxTreeNode *pSVar5;
  const_iterator cVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  _Hash_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  SyntaxTreeNode *son;
  int second;
  SyntaxTreeNode *local_60;
  string *local_58;
  undefined4 local_4c;
  SyntaxTreeNode *local_48;
  uint *local_40;
  __node_base *local_38;
  
  this_00 = (SyntaxTreeNode *)operator_new(0x90);
  (this_00->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->first_pos)._M_h._M_buckets = &(this_00->first_pos)._M_h._M_single_bucket;
  (this_00->first_pos)._M_h._M_bucket_count = 1;
  (this_00->first_pos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->first_pos)._M_h._M_element_count = 0;
  (this_00->first_pos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->first_pos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->first_pos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->last_pos)._M_h._M_buckets = &(this_00->last_pos)._M_h._M_single_bucket;
  (this_00->last_pos)._M_h._M_bucket_count = 1;
  (this_00->last_pos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->last_pos)._M_h._M_element_count = 0;
  (this_00->last_pos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->last_pos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->last_pos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this_00->last_pos)._M_h._M_single_bucket + 5) = 0;
  cVar2 = (expr->_M_dataplus)._M_p[*curr_pos];
  local_58 = expr;
  if (cVar2 == '$') {
    this_00->nullable = true;
  }
  else if (cVar2 == '(') {
    *curr_pos = *curr_pos + 1;
    pSVar5 = expression_eval(this,expr,curr_pos);
    local_60 = pSVar5;
    if (pSVar5 != this_00) {
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this_00->first_pos,&(pSVar5->first_pos)._M_h);
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this_00->last_pos,&(pSVar5->last_pos)._M_h);
    }
    __position._M_current =
         (this_00->sons).
         super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->sons).
        super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
      ::_M_realloc_insert<RegexToDFAConverter::SyntaxTreeNode*const&>
                ((vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
                  *)this_00,__position,&local_60);
      pSVar5 = local_60;
    }
    else {
      *__position._M_current = pSVar5;
      pppSVar1 = &(this_00->sons).
                  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    this_00->nullable = pSVar5->nullable;
    SyntaxTreeNode::wipe_sons(this_00);
  }
  else {
    local_60 = (SyntaxTreeNode *)CONCAT71(local_60._1_7_,cVar2);
    cVar6 = std::
            _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&kLetters._M_h,(key_type *)&local_60);
    if (((cVar6.super__Node_iterator_base<char,_false>._M_cur == (__node_type *)0x0) &&
        ((char)local_60 != '$')) && (iVar3 = *curr_pos, (expr->_M_dataplus)._M_p[iVar3] != '#')) {
      this_00->nullable = true;
      *curr_pos = iVar3 + -1;
    }
    else {
      iVar3 = this->leaves_count_;
      this->leaves_count_ = iVar3 + 1;
      std::
      vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
      ::resize(&this->follow_pos_,(long)iVar3 + 2);
      std::vector<char,_std::allocator<char>_>::resize
                (&this->what_letter_,(long)this->leaves_count_ + 1);
      this_00->nullable = false;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_60;
      local_60._0_4_ = this->leaves_count_;
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::operator=(&(this_00->first_pos)._M_h,__l);
      local_60 = (SyntaxTreeNode *)CONCAT44(local_60._4_4_,this->leaves_count_);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_60;
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::operator=(&(this_00->last_pos)._M_h,__l_00);
      iVar3 = this->leaves_count_;
      this_00->leaf_index = iVar3;
      (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = (expr->_M_dataplus)._M_p[*curr_pos];
    }
  }
  uVar7 = (long)*curr_pos + 1;
  *curr_pos = (int)uVar7;
  uVar8 = (uint)local_58->_M_string_length;
  local_48 = this_00;
  if (((int)uVar7 < (int)uVar8) && ((local_58->_M_dataplus)._M_p[uVar7] == '*')) {
    this_00->nullable = true;
    p_Var11 = (this_00->last_pos)._M_h._M_before_begin._M_nxt;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      local_38 = &(this_00->first_pos)._M_h._M_before_begin;
      local_40 = (uint *)curr_pos;
      do {
        p_Var10 = local_38->_M_nxt;
        if (p_Var10 != (_Hash_node_base *)0x0) {
          iVar3 = *(int *)&p_Var11[1]._M_nxt;
          do {
            local_4c = *(undefined4 *)&p_Var10[1]._M_nxt;
            local_60 = (SyntaxTreeNode *)
                       ((this->follow_pos_).
                        super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar3);
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_60,&local_4c,&local_60);
            p_Var10 = p_Var10->_M_nxt;
          } while (p_Var10 != (_Hash_node_base *)0x0);
        }
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
      uVar8 = (uint)local_58->_M_string_length;
      uVar7 = (ulong)*local_40;
      curr_pos = (int *)local_40;
    }
  }
  uVar4 = (uint)uVar7;
  if ((int)uVar4 < (int)uVar8) {
    pcVar9 = (local_58->_M_dataplus)._M_p + (int)uVar4;
    do {
      uVar4 = uVar4 + 1;
      if (*pcVar9 != '*') {
        return local_48;
      }
      *curr_pos = uVar4;
      pcVar9 = pcVar9 + 1;
    } while (uVar4 != uVar8);
  }
  return local_48;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::factor_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  if (expr[curr_pos] == '(') {
    curr_pos++;
    auto son = expression_eval(expr, curr_pos);
    root->first_pos = son->first_pos;
    root->last_pos = son->last_pos;
    root->sons.push_back(son);
    root->nullable = son->nullable;
    root->wipe_sons();
  }
  else {
    if (expr[curr_pos] == kLambda)
      root->nullable = true;
    else if (!is_letter(expr[curr_pos]) && expr[curr_pos] != '#')
      root->nullable = true, --curr_pos;
    else {
      ++leaves_count_;
      follow_pos_.resize((size_t)leaves_count_ + 1);
      what_letter_.resize((size_t)leaves_count_ + 1);
      root->nullable = false;
      root->first_pos = {leaves_count_};
      root->last_pos = {leaves_count_};
      root->leaf_index = leaves_count_;
      what_letter_[leaves_count_] = expr[curr_pos];
    }
  }

  if (++curr_pos < (int)expr.size() && expr[curr_pos] == '*') {
    root->nullable = true;
    for (int first : root->last_pos)
      for (int second : root->first_pos)
        follow_pos_[first].insert(second);
  }
  while (curr_pos < (int)expr.size() && expr[curr_pos] == '*')
    curr_pos++;
  return root;
}